

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int runsiz(runsdef *item)

{
  char cVar1;
  int iVar2;
  char *in_RDI;
  
  cVar1 = *in_RDI;
  if (cVar1 == '\x01') {
    return 4;
  }
  if (cVar1 != '\x02') {
    if ((cVar1 == '\x03') || (cVar1 == '\a')) {
      iVar2 = osrp2(*(void **)(in_RDI + 8));
      return iVar2;
    }
    if ((cVar1 != '\n') && (cVar1 != '\r')) {
      return 0;
    }
  }
  return 2;
}

Assistant:

int runsiz(runsdef *item)
{
    switch(item->runstyp)
    {
    case DAT_NUMBER:
        return(4);
    case DAT_SSTRING:
    case DAT_LIST:
        return(osrp2(item->runsv.runsvstr));
    case DAT_PROPNUM:
    case DAT_OBJECT:
    case DAT_FNADDR:
        return(2);
    default:
        return(0);
    }
}